

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

int xmlAddEncodingAlias(char *name,char *alias)

{
  __int32_t _Var1;
  ulong uVar2;
  int iVar3;
  __int32_t **pp_Var4;
  xmlCharEncodingAliasPtr pxVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  char upper [100];
  
  iVar9 = -1;
  if (alias != (char *)0x0 && name != (char *)0x0) {
    for (lVar12 = 0; lVar12 != 99; lVar12 = lVar12 + 1) {
      pp_Var4 = __ctype_toupper_loc();
      _Var1 = (*pp_Var4)[(byte)alias[lVar12]];
      upper[lVar12] = (char)_Var1;
      if ((char)_Var1 == '\0') break;
    }
    upper[lVar12] = '\0';
    pxVar5 = xmlCharEncodingAliases;
    uVar11 = xmlCharEncodingAliasesMax;
    if (xmlCharEncodingAliasesMax <= xmlCharEncodingAliasesNb) {
      if (xmlCharEncodingAliasesMax < 1) {
        uVar11 = 0x14;
      }
      else {
        if (999999999 < (uint)xmlCharEncodingAliasesMax) {
          return -1;
        }
        uVar10 = xmlCharEncodingAliasesMax + 1U >> 1;
        uVar11 = uVar10 + xmlCharEncodingAliasesMax;
        if (1000000000 - uVar10 < (uint)xmlCharEncodingAliasesMax) {
          uVar11 = 1000000000;
        }
      }
      pxVar5 = (xmlCharEncodingAliasPtr)(*xmlRealloc)(xmlCharEncodingAliases,(ulong)uVar11 << 4);
      if (pxVar5 == (xmlCharEncodingAliasPtr)0x0) {
        return -1;
      }
    }
    xmlCharEncodingAliasesMax = uVar11;
    xmlCharEncodingAliases = pxVar5;
    pxVar5 = xmlCharEncodingAliases;
    uVar13 = (ulong)(uint)xmlCharEncodingAliasesNb;
    if (xmlCharEncodingAliasesNb < 1) {
      uVar13 = 0;
    }
    uVar2 = 0;
    do {
      uVar8 = uVar2;
      if (uVar13 * 0x10 + 0x10 == uVar8 + 0x10) {
        pcVar6 = (*xmlMemStrdup)(name);
        if (pcVar6 == (char *)0x0) {
          return -1;
        }
        pcVar7 = (*xmlMemStrdup)(upper);
        pxVar5 = xmlCharEncodingAliases;
        if (pcVar7 == (char *)0x0) {
          (*xmlFree)(pcVar6);
          return -1;
        }
        lVar12 = (long)xmlCharEncodingAliasesNb;
        xmlCharEncodingAliasesNb = xmlCharEncodingAliasesNb + 1;
        xmlCharEncodingAliases[lVar12].name = pcVar6;
        pxVar5[lVar12].alias = pcVar7;
        goto LAB_0012c550;
      }
      iVar3 = strcmp(*(char **)((long)&pxVar5->alias + uVar8),upper);
      uVar2 = uVar8 + 0x10;
    } while (iVar3 != 0);
    pcVar6 = (*xmlMemStrdup)(name);
    if (pcVar6 != (char *)0x0) {
      (*xmlFree)(*(void **)((long)&xmlCharEncodingAliases->name + uVar8));
      *(char **)((long)&xmlCharEncodingAliases->name + uVar8) = pcVar6;
LAB_0012c550:
      iVar9 = 0;
    }
  }
  return iVar9;
}

Assistant:

int
xmlAddEncodingAlias(const char *name, const char *alias) {
    int i;
    char upper[100];
    char *nameCopy, *aliasCopy;

    if ((name == NULL) || (alias == NULL))
	return(-1);

    for (i = 0;i < 99;i++) {
        upper[i] = (char) toupper((unsigned char) alias[i]);
	if (upper[i] == 0) break;
    }
    upper[i] = 0;

    if (xmlCharEncodingAliasesNb >= xmlCharEncodingAliasesMax) {
        xmlCharEncodingAliasPtr tmp;
        int newSize;

        newSize = xmlGrowCapacity(xmlCharEncodingAliasesMax, sizeof(tmp[0]),
                                  20, XML_MAX_ITEMS);
        if (newSize < 0)
            return(-1);
        tmp = xmlRealloc(xmlCharEncodingAliases, newSize * sizeof(tmp[0]));
        if (tmp == NULL)
            return(-1);
        xmlCharEncodingAliases = tmp;
        xmlCharEncodingAliasesMax = newSize;
    }

    /*
     * Walk down the list looking for a definition of the alias
     */
    for (i = 0;i < xmlCharEncodingAliasesNb;i++) {
	if (!strcmp(xmlCharEncodingAliases[i].alias, upper)) {
	    /*
	     * Replace the definition.
	     */
	    nameCopy = xmlMemStrdup(name);
            if (nameCopy == NULL)
                return(-1);
	    xmlFree((char *) xmlCharEncodingAliases[i].name);
	    xmlCharEncodingAliases[i].name = nameCopy;
	    return(0);
	}
    }
    /*
     * Add the definition
     */
    nameCopy = xmlMemStrdup(name);
    if (nameCopy == NULL)
        return(-1);
    aliasCopy = xmlMemStrdup(upper);
    if (aliasCopy == NULL) {
        xmlFree(nameCopy);
        return(-1);
    }
    xmlCharEncodingAliases[xmlCharEncodingAliasesNb].name = nameCopy;
    xmlCharEncodingAliases[xmlCharEncodingAliasesNb].alias = aliasCopy;
    xmlCharEncodingAliasesNb++;
    return(0);
}